

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::ruby::GenerateMessageAssignment
          (ruby *this,string_view prefix,Descriptor *message,Printer *printer)

{
  char *pcVar1;
  char *pcVar2;
  ruby *prVar3;
  Printer *printer_00;
  long lVar4;
  long lVar5;
  string_view text;
  string_view text_00;
  string_view prefix_00;
  string_view prefix_01;
  string_view name;
  string_view name_00;
  string nested_prefix;
  string local_100;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  string local_d0;
  undefined1 local_b0 [48];
  AlphaNum local_80;
  AlphaNum local_50;
  
  pcVar2 = prefix._M_str;
  local_e0._M_str = (char *)prefix._M_len;
  if (*(char *)(*(long *)(pcVar2 + 0x28) + 0x53) == '\0') {
    prVar3 = (ruby *)(ulong)**(ushort **)(pcVar2 + 0x10);
    name._M_len = ~(ulong)prVar3 + (long)*(ushort **)(pcVar2 + 0x10);
    name._M_str = (char *)message;
    local_e0._M_len = (size_t)this;
    RubifyConstant_abi_cxx11_((string *)local_b0,prVar3,name);
    text._M_str = "$prefix$$name$ = ";
    text._M_len = 0x11;
    io::Printer::
    Print<char[7],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
              ((Printer *)message,text,(char (*) [7])0x13f1099,&local_e0,(char (*) [5])0x10f3c63,
               (string *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    local_b0._0_8_ = ZEXT28(*(ushort *)(*(long *)(pcVar2 + 0x10) + 2));
    printer_00 = (Printer *)local_b0;
    local_b0._8_8_ = ~local_b0._0_8_ + *(long *)(pcVar2 + 0x10);
    pcVar1 = "full_name";
    text_00._M_str =
         "::Google::Protobuf::DescriptorPool.generated_pool.lookup(\"$full_name$\").msgclass\n";
    text_00._M_len = 0x51;
    io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
              ((Printer *)message,text_00,(char (*) [10])0x13f0d39,
               (basic_string_view<char,_std::char_traits<char>_> *)printer_00);
    local_b0._0_8_ = local_e0._M_len;
    local_b0._8_8_ = local_e0._M_str;
    prVar3 = (ruby *)(ulong)**(ushort **)(pcVar2 + 0x10);
    name_00._M_len = ~(ulong)prVar3 + (long)*(ushort **)(pcVar2 + 0x10);
    name_00._M_str = pcVar1;
    RubifyConstant_abi_cxx11_(&local_d0,prVar3,name_00);
    local_50.piece_._M_len = local_d0._M_string_length;
    local_50.piece_._M_str = local_d0._M_dataplus._M_p;
    local_80.piece_._M_len = 2;
    local_80.piece_._M_str = "::";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_100,(lts_20250127 *)local_b0,&local_50,&local_80,(AlphaNum *)printer_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (0 < *(int *)(pcVar2 + 0x88)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        prefix_00._M_str = (char *)(*(long *)(pcVar2 + 0x50) + lVar5);
        prefix_00._M_len = (size_t)local_100._M_dataplus._M_p;
        GenerateMessageAssignment((ruby *)local_100._M_string_length,prefix_00,message,printer_00);
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0xa0;
      } while (lVar4 < *(int *)(pcVar2 + 0x88));
    }
    if (0 < *(int *)(pcVar2 + 0x8c)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        prefix_01._M_str = (char *)(*(long *)(pcVar2 + 0x58) + lVar5);
        prefix_01._M_len = (size_t)local_100._M_dataplus._M_p;
        GenerateEnumAssignment
                  ((ruby *)local_100._M_string_length,prefix_01,(EnumDescriptor *)message,printer_00
                  );
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x58;
      } while (lVar4 < *(int *)(pcVar2 + 0x8c));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenerateMessageAssignment(absl::string_view prefix,
                               const Descriptor* message,
                               io::Printer* printer) {
  // Don't generate MapEntry messages -- we use the Ruby extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  printer->Print("$prefix$$name$ = ", "prefix", prefix, "name",
                 RubifyConstant(message->name()));
  printer->Print(
      "::Google::Protobuf::DescriptorPool.generated_pool."
      "lookup(\"$full_name$\").msgclass\n",
      "full_name", message->full_name());

  std::string nested_prefix =
      absl::StrCat(prefix, RubifyConstant(message->name()), "::");
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageAssignment(nested_prefix, message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumAssignment(nested_prefix, message->enum_type(i), printer);
  }
}